

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spirv_glsl.cpp
# Opt level: O0

bool __thiscall spirv_cross::CompilerGLSL::should_dereference(CompilerGLSL *this,uint32_t id)

{
  bool bVar1;
  uint32_t uVar2;
  uint32_t uVar3;
  SPIRType *type_00;
  SPIRVariable *pSVar4;
  SPIRType *pSVar5;
  byte local_59;
  bool local_52;
  byte local_51;
  SPIRType *src_type;
  SPIRVariable *var_1;
  SPIRExpression *expr;
  SPIRVariable *var;
  SPIRType *type;
  uint32_t id_local;
  CompilerGLSL *this_local;
  
  type_00 = Compiler::expression_type(&this->super_Compiler,id);
  bVar1 = Compiler::is_pointer(&this->super_Compiler,type_00);
  if (!bVar1) {
    return false;
  }
  bVar1 = Compiler::expression_is_lvalue(&this->super_Compiler,id);
  if (!bVar1) {
    return false;
  }
  pSVar4 = Compiler::maybe_get<spirv_cross::SPIRVariable>(&this->super_Compiler,id);
  if (pSVar4 == (SPIRVariable *)0x0) {
    var_1 = (SPIRVariable *)
            Compiler::maybe_get<spirv_cross::SPIRExpression>(&this->super_Compiler,id);
    if ((SPIRExpression *)var_1 == (SPIRExpression *)0x0) {
      return true;
    }
    if ((((SPIRExpression *)var_1)->access_chain & 1U) != 0) {
      return false;
    }
    src_type = (SPIRType *)0x0;
    while( true ) {
      uVar2 = TypedID::operator_cast_to_unsigned_int
                        ((TypedID *)((long)&(var_1->dereference_chain).buffer_capacity + 4));
      local_52 = false;
      if (uVar2 != 0) {
        uVar2 = TypedID::operator_cast_to_unsigned_int((TypedID *)&(var_1->super_IVariant).self);
        local_52 = expression_is_forwarded(this,uVar2);
      }
      if (local_52 == false) break;
      uVar2 = TypedID::operator_cast_to_unsigned_int
                        ((TypedID *)((long)&(var_1->dereference_chain).buffer_capacity + 4));
      pSVar5 = Compiler::expression_type(&this->super_Compiler,uVar2);
      if (((pSVar5->pointer & 1U) != (type_00->pointer & 1U)) ||
         (pSVar5->pointer_depth != type_00->pointer_depth)) break;
      uVar2 = TypedID::operator_cast_to_unsigned_int((TypedID *)&pSVar5->parent_type);
      uVar3 = TypedID::operator_cast_to_unsigned_int((TypedID *)&type_00->parent_type);
      if (uVar2 != uVar3) break;
      uVar2 = TypedID::operator_cast_to_unsigned_int
                        ((TypedID *)((long)&(var_1->dereference_chain).buffer_capacity + 4));
      src_type = (SPIRType *)
                 Compiler::maybe_get<spirv_cross::SPIRVariable>(&this->super_Compiler,uVar2);
      if (src_type != (SPIRType *)0x0) break;
      uVar2 = TypedID::operator_cast_to_unsigned_int
                        ((TypedID *)((long)&(var_1->dereference_chain).buffer_capacity + 4));
      var_1 = (SPIRVariable *)
              Compiler::maybe_get<spirv_cross::SPIRExpression>(&this->super_Compiler,uVar2);
      if ((SPIRExpression *)var_1 == (SPIRExpression *)0x0) break;
    }
    local_59 = 1;
    if (src_type != (SPIRType *)0x0) {
      local_59 = *(byte *)((long)&(src_type->member_types).
                                  super_VectorView<spirv_cross::TypedID<(spirv_cross::Types)1>_>.ptr
                          + 1);
    }
    return (bool)(local_59 & 1);
  }
  if (pSVar4->parameter != (Parameter *)0x0) {
    bVar1 = Compiler::is_physical_pointer(&this->super_Compiler,type_00);
    local_51 = 1;
    if (bVar1) goto LAB_00475e81;
  }
  local_51 = pSVar4->phi_variable;
LAB_00475e81:
  return (bool)(local_51 & 1);
}

Assistant:

bool CompilerGLSL::should_dereference(uint32_t id)
{
	const auto &type = expression_type(id);
	// Non-pointer expressions don't need to be dereferenced.
	if (!is_pointer(type))
		return false;

	// Handles shouldn't be dereferenced either.
	if (!expression_is_lvalue(id))
		return false;

	// If id is a variable but not a phi variable, we should not dereference it.
	// BDA passed around as parameters are always pointers.
	if (auto *var = maybe_get<SPIRVariable>(id))
		return (var->parameter && is_physical_pointer(type)) || var->phi_variable;

	if (auto *expr = maybe_get<SPIRExpression>(id))
	{
		// If id is an access chain, we should not dereference it.
		if (expr->access_chain)
			return false;

		// If id is a forwarded copy of a variable pointer, we should not dereference it.
		SPIRVariable *var = nullptr;
		while (expr->loaded_from && expression_is_forwarded(expr->self))
		{
			auto &src_type = expression_type(expr->loaded_from);
			// To be a copy, the pointer and its source expression must be the
			// same type. Can't check type.self, because for some reason that's
			// usually the base type with pointers stripped off. This check is
			// complex enough that I've hoisted it out of the while condition.
			if (src_type.pointer != type.pointer || src_type.pointer_depth != type.pointer_depth ||
			    src_type.parent_type != type.parent_type)
				break;
			if ((var = maybe_get<SPIRVariable>(expr->loaded_from)))
				break;
			if (!(expr = maybe_get<SPIRExpression>(expr->loaded_from)))
				break;
		}

		return !var || var->phi_variable;
	}

	// Otherwise, we should dereference this pointer expression.
	return true;
}